

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpOperations.cpp
# Opt level: O0

pointer gmlc::networking::establishConnection
                  (io_context *io_context,string *host,string *port,milliseconds timeOut)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  pointer pVar1;
  string *in_stack_00000118;
  string *in_stack_00000120;
  io_context *in_stack_00000128;
  SocketFactory *in_stack_00000130;
  milliseconds in_stack_00000138;
  
  SocketFactory::SocketFactory((SocketFactory *)in_RDI);
  establishConnection(in_stack_00000130,in_stack_00000128,in_stack_00000120,in_stack_00000118,
                      in_stack_00000138);
  SocketFactory::~SocketFactory((SocketFactory *)0x6f3ef2);
  pVar1.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar1.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (pointer)pVar1.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpConnection::pointer establishConnection(
    asio::io_context& io_context,
    const std::string& host,
    const std::string& port,
    std::chrono::milliseconds timeOut)
{
    return establishConnection(
        SocketFactory(), io_context, host, port, timeOut);
}